

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdnslookup.cpp
# Opt level: O3

bool __thiscall
QDnsLookupRunnable::sendDnsOverTls
          (QDnsLookupRunnable *this,QDnsLookupReply *reply,
          QSpan<unsigned_char,_18446744073709551615UL> query,ReplyBuffer *response)

{
  optional<QSslConfiguration> *this_00;
  byte *pbVar1;
  _Storage<QSslConfiguration,_false> _Var2;
  void *pvVar3;
  char16_t *pcVar4;
  qsizetype qVar5;
  bool bVar6;
  int iVar7;
  SocketError SVar8;
  qint64 qVar9;
  long lVar10;
  ulong uVar11;
  Error EVar12;
  ulong uVar13;
  _Storage<QSslConfiguration,_false> *other;
  long in_FS_OFFSET;
  QByteArrayView QVar14;
  quint16 size;
  ushort local_8a;
  _Storage<QSslConfiguration,_false> local_88;
  char16_t *pcStack_80;
  qsizetype local_78;
  undefined1 local_68 [16];
  _Storage<QSslConfiguration,_false> local_58;
  char16_t *pcStack_50;
  qsizetype local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_68._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_68._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QSslSocket::QSslSocket((QSslSocket *)local_68,(QObject *)0x0);
  QSslConfiguration::defaultConfiguration();
  other = (_Storage<QSslConfiguration,_false> *)&this->sslConfiguration;
  if ((this->sslConfiguration).super__Optional_base<QSslConfiguration,_false,_false>._M_payload.
      super__Optional_payload<QSslConfiguration,_true,_false,_false>.
      super__Optional_payload_base<QSslConfiguration>._M_engaged == false) {
    other = &local_88;
  }
  QSslConfiguration::QSslConfiguration(&local_58._M_value,&other->_M_value);
  QSslSocket::setSslConfiguration((QSslSocket *)local_68,&local_58._M_value);
  QSslConfiguration::~QSslConfiguration(&local_58._M_value);
  QSslConfiguration::~QSslConfiguration(&local_88._M_value);
  QVar14.m_data = (storage_type *)0x8;
  QVar14.m_size = (qsizetype)&local_58;
  QString::fromLatin1(QVar14);
  local_88 = local_58;
  pcStack_80 = pcStack_50;
  local_78 = local_48;
  QAbstractSocket::setProtocolTag((QAbstractSocket *)local_68,(QString *)&local_88._M_value);
  if (local_88.field2 != 0) {
    LOCK();
    *(int *)local_88 = *(int *)local_88 + -1;
    UNLOCK();
    if (*(int *)local_88 == 0) {
      QArrayData::deallocate((QArrayData *)local_88,2,0x10);
    }
  }
  pbVar1 = query.super_QSpanBase<unsigned_char,_18446744073709551615UL>.m_data + 3;
  *pbVar1 = *pbVar1 | 0x20;
  local_8a = (ushort)query.super_QSpanBase<unsigned_char,_18446744073709551615UL>.m_size << 8 |
             (ushort)query.super_QSpanBase<unsigned_char,_18446744073709551615UL>.m_size >> 8;
  local_88 = (_Storage<QSslConfiguration,_false>)0x0;
  pcStack_80 = (char16_t *)&DAT_100000000;
  QDeadlineTimer::setPreciseRemainingTime((longlong)&local_88,0,0xf08eb000);
  QHostAddress::toString((QString *)&local_58._M_value,&this->nameserver);
  QSslSocket::connectToHostEncrypted
            ((QSslSocket *)local_68,(QString *)&local_58._M_value,this->port,(OpenMode)0x3,
             AnyIPProtocol);
  if (local_58.field2 != 0) {
    LOCK();
    *(int *)local_58 = *(int *)local_58 + -1;
    UNLOCK();
    if (*(int *)local_58 == 0) {
      QArrayData::deallocate((QArrayData *)local_58,2,0x10);
    }
  }
  QIODevice::write((char *)local_68,(longlong)&local_8a);
  QIODevice::write((char *)local_68,
                   (longlong)query.super_QSpanBase<unsigned_char,_18446744073709551615UL>.m_data);
  bVar6 = QSslSocket::waitForEncrypted((QSslSocket *)local_68,15000);
  if (bVar6) {
    QSslSocket::sslConfiguration((QSslSocket *)&local_58._M_value);
    this_00 = &reply->sslConfiguration;
    if ((reply->sslConfiguration).super__Optional_base<QSslConfiguration,_false,_false>._M_payload.
        super__Optional_payload<QSslConfiguration,_true,_false,_false>.
        super__Optional_payload_base<QSslConfiguration>._M_engaged == true) {
      _Var2._M_value.d.d.ptr =
           *(QSslConfiguration *)
            &(this_00->super__Optional_base<QSslConfiguration,_false,_false>)._M_payload.
             super__Optional_payload<QSslConfiguration,_true,_false,_false>.
             super__Optional_payload_base<QSslConfiguration>._M_payload;
      (this_00->super__Optional_base<QSslConfiguration,_false,_false>)._M_payload.
      super__Optional_payload<QSslConfiguration,_true,_false,_false>.
      super__Optional_payload_base<QSslConfiguration>._M_payload = local_58;
      local_58._M_value.d.d.ptr = _Var2._M_value.d.d.ptr;
    }
    else {
      QSslConfiguration::QSslConfiguration((QSslConfiguration *)this_00,&local_58._M_value);
      (reply->sslConfiguration).super__Optional_base<QSslConfiguration,_false,_false>._M_payload.
      super__Optional_payload<QSslConfiguration,_true,_false,_false>.
      super__Optional_payload_base<QSslConfiguration>._M_engaged = true;
    }
    QSslConfiguration::~QSslConfiguration(&local_58._M_value);
    iVar7 = QDeadlineTimer::remainingTime();
    if (iVar7 < 0) {
LAB_00227b9f:
      lVar10 = QIODevice::read(local_68,(longlong)&local_8a);
      if (lVar10 == 2) {
        local_8a = local_8a << 8 | local_8a >> 8;
        uVar11 = (ulong)local_8a;
        uVar13 = (response->super_QVLABase<unsigned_char>).super_QVLABaseBase.a;
        if ((long)uVar13 <= (long)uVar11) {
          uVar13 = uVar11;
        }
        QVLABase<unsigned_char>::reallocate_impl
                  (&response->super_QVLABase<unsigned_char>,0x4d0,
                   &response->super_QVLAStorage<1UL,_1UL,_1232LL>,uVar11,uVar13);
        (response->super_QVLABase<unsigned_char>).super_QVLABaseBase.s = uVar11;
        pvVar3 = (response->super_QVLABase<unsigned_char>).super_QVLABaseBase.ptr;
        uVar13 = (ulong)local_8a;
        iVar7 = QDeadlineTimer::remainingTime();
        if (iVar7 < 0) {
LAB_00227c34:
          uVar11 = QIODevice::read(local_68,(longlong)pvVar3);
          if (uVar11 == uVar13) {
            if (3 < local_8a) {
              reply->authenticData =
                   (bool)(*(byte *)((long)(response->super_QVLABase<unsigned_char>).
                                          super_QVLABaseBase.ptr + 3) >> 5 & 1);
            }
            bVar6 = true;
            goto LAB_00227ce4;
          }
        }
        else {
          do {
            qVar9 = QSslSocket::bytesAvailable((QSslSocket *)local_68);
            if ((long)uVar13 <= qVar9) goto LAB_00227c34;
            bVar6 = QSslSocket::waitForReadyRead((QSslSocket *)local_68,iVar7);
          } while (bVar6);
        }
      }
    }
    else {
      do {
        qVar9 = QSslSocket::bytesAvailable((QSslSocket *)local_68);
        if (1 < qVar9) goto LAB_00227b9f;
        bVar6 = QSslSocket::waitForReadyRead((QSslSocket *)local_68,iVar7);
      } while (bVar6);
    }
  }
  SVar8 = QAbstractSocket::error((QAbstractSocket *)local_68);
  EVar12 = ResolverError;
  if (SVar8 == ProxyConnectionTimeoutError) {
    EVar12 = TimeoutError;
  }
  if (SVar8 == SocketTimeoutError) {
    EVar12 = TimeoutError;
  }
  QIODevice::errorString();
  reply->error = EVar12;
  _Var2 = (_Storage<QSslConfiguration,_false>)(reply->errorString).d.d;
  pcVar4 = (reply->errorString).d.ptr;
  (reply->errorString).d.d = (Data *)local_58;
  (reply->errorString).d.ptr = pcStack_50;
  qVar5 = (reply->errorString).d.size;
  (reply->errorString).d.size = local_48;
  local_58 = _Var2;
  pcStack_50 = pcVar4;
  local_48 = qVar5;
  if ((QArrayData *)_Var2.field2 != (QArrayData *)0x0) {
    LOCK();
    *(int *)_Var2 = *(int *)_Var2 + -1;
    UNLOCK();
    if (*(int *)_Var2 == 0) {
      QArrayData::deallocate((QArrayData *)_Var2,2,0x10);
    }
  }
  bVar6 = false;
LAB_00227ce4:
  QSslSocket::~QSslSocket((QSslSocket *)local_68);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return bVar6;
}

Assistant:

bool QDnsLookupRunnable::sendDnsOverTls(QDnsLookupReply *reply, QSpan<unsigned char> query,
                                        ReplyBuffer &response)
{
    QSslSocket socket;
    socket.setSslConfiguration(sslConfiguration.value_or(QSslConfiguration::defaultConfiguration()));

#  if QT_CONFIG(networkproxy)
    socket.setProtocolTag("domain-s"_L1);
#  endif

    // Request the name server attempt to authenticate the reply.
    query[3] |= DnsAuthenticDataBit;

    do {
        quint16 size = qToBigEndian<quint16>(query.size());
        QDeadlineTimer timeout(DnsOverTlsTimeout);

        socket.connectToHostEncrypted(nameserver.toString(), port);
        socket.write(reinterpret_cast<const char *>(&size), sizeof(size));
        socket.write(reinterpret_cast<const char *>(query.data()), query.size());
        if (!socket.waitForEncrypted(DnsOverTlsConnectTimeout.count()))
            break;

        reply->sslConfiguration = socket.sslConfiguration();

        // accumulate reply
        auto waitForBytes = [&](void *buffer, int count) {
            int remaining = timeout.remainingTime();
            while (remaining >= 0 && socket.bytesAvailable() < count) {
                if (!socket.waitForReadyRead(remaining))
                    return false;
            }
            return socket.read(static_cast<char *>(buffer), count) == count;
        };
        if (!waitForBytes(&size, sizeof(size)))
            break;

        // note: strictly speaking, we're allocating memory based on untrusted data
        // but in practice, due to limited range of the data type (16 bits),
        // the maximum allocation is small.
        size = qFromBigEndian(size);
        response.resize(size);
        if (waitForBytes(response.data(), size)) {
            // check if the AD bit is set; we'll trust it over TLS requests
            if (size >= 4)
                reply->authenticData = response[3] & DnsAuthenticDataBit;
            return true;
        }
    } while (false);

    // handle errors
    return makeReplyErrorFromSocket(reply, &socket);
}